

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

err_t btokSMCmdWrap(octet *apdu,size_t *count,apdu_cmd_t *cmd,void *state)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  octet *poVar4;
  long lVar5;
  octet *poVar6;
  void *in_RCX;
  apdu_cmd_t *in_RDX;
  size_t *in_RSI;
  byte *in_RDI;
  size_t l;
  btok_sm_st *st;
  size_t c;
  size_t offset;
  size_t cdf_len_len;
  size_t cdf_len;
  apdu_cmd_t *in_stack_ffffffffffffff98;
  apdu_cmd_t *in_stack_ffffffffffffffa0;
  octet *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  u32 tag;
  octet *in_stack_ffffffffffffffb8;
  octet *local_40;
  octet *local_30;
  err_t local_4;
  
  tag = (u32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  bVar1 = apduCmdIsValid(in_stack_ffffffffffffffa0);
  if ((bVar1 == 0) || ((in_RCX != (void *)0x0 && ((in_RDX->cla & 4) != 0)))) {
    local_4 = 0x138;
  }
  else {
    sVar3 = apduCmdEnc(&in_stack_ffffffffffffffa0->cla,in_stack_ffffffffffffff98);
    if (sVar3 == 0xffffffffffffffff) {
      local_4 = 0x138;
    }
    else if (in_RCX == (void *)0x0) {
      if (in_RSI != (size_t *)0x0) {
        *in_RSI = sVar3;
      }
      local_4 = 0;
    }
    else {
      local_30 = (octet *)in_RDX->cdf_len;
      if (in_RDX->cdf_len != 0) {
        in_stack_ffffffffffffffb8 =
             (octet *)derTLEnc(in_stack_ffffffffffffffb8,tag,(size_t)in_stack_ffffffffffffffa8);
        local_30 = in_stack_ffffffffffffffb8 + 1 + (long)local_30;
      }
      if (in_RDX->rdf_len != 0) {
        apduCmdRDFLenLen(in_RDX);
        in_stack_ffffffffffffffb8 =
             (octet *)derEnc(in_stack_ffffffffffffffb8,tag,in_stack_ffffffffffffffa8,
                             (size_t)in_stack_ffffffffffffffa0);
        local_30 = in_stack_ffffffffffffffb8 + (long)local_30;
      }
      poVar4 = (octet *)derEnc(in_stack_ffffffffffffffb8,tag,in_stack_ffffffffffffffa8,
                               (size_t)in_stack_ffffffffffffffa0);
      local_30 = poVar4 + (long)local_30;
      iVar2 = 3;
      if (local_30 < (octet *)0x100) {
        iVar2 = 1;
      }
      lVar5 = (long)iVar2;
      if (in_RDI == (byte *)0x0) {
        if (in_RSI != (size_t *)0x0) {
          *in_RSI = (size_t)(local_30 + lVar5 + 5);
        }
        local_4 = 0;
      }
      else if ((uint)*(byte *)((long)in_RCX + 0x40) % 2 == 1) {
        *in_RDI = *in_RDI | 4;
        local_40 = (octet *)(lVar5 + 4);
        if (in_RDX->cdf_len != 0) {
          poVar4 = (octet *)derTLEnc(poVar4,(u32)((ulong)in_RCX >> 0x20),
                                     (size_t)in_stack_ffffffffffffffa8);
          in_stack_ffffffffffffffa0 = (apdu_cmd_t *)(in_RDI + (long)local_40 + (long)poVar4 + 1);
          in_stack_ffffffffffffff98 = (apdu_cmd_t *)(in_RDI + 4);
          apduCmdCDFLenLen(in_RDX);
          memMove(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1735be);
          in_RDI[(long)(local_40 + (long)poVar4)] = 2;
          poVar4 = (octet *)derTLEnc(poVar4,(u32)((ulong)in_RCX >> 0x20),
                                     (size_t)in_stack_ffffffffffffffa8);
          poVar6 = poVar4 + 1;
          beltCFBStart(in_RCX,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,
                       &in_stack_ffffffffffffff98->cla);
          beltCFBStepE(in_RCX,(size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          local_40 = poVar6 + (long)local_40 + in_RDX->cdf_len;
        }
        if (lVar5 == 1) {
          in_RDI[4] = (byte)local_30;
        }
        else {
          in_RDI[4] = 0;
          in_RDI[5] = (byte)((ulong)local_30 >> 8);
          in_RDI[6] = (byte)local_30;
        }
        if (in_RDX->rdf_len != 0) {
          in_stack_ffffffffffffffa8 = (octet *)apduCmdRDFLenLen(in_RDX);
          poVar4 = (octet *)derTLEnc(poVar4,(u32)((ulong)in_RCX >> 0x20),
                                     (size_t)in_stack_ffffffffffffffa8);
          local_40 = poVar4 + (long)local_40;
          if (in_stack_ffffffffffffffa8 == (octet *)0x1) {
            in_RDI[(long)local_40] = (byte)in_RDX->rdf_len;
          }
          else if (in_stack_ffffffffffffffa8 == (octet *)0x2) {
            in_RDI[(long)local_40] = (byte)(in_RDX->rdf_len >> 8);
            (in_RDI + 1)[(long)local_40] = (byte)in_RDX->rdf_len;
          }
          else {
            in_RDI[(long)local_40] = 0;
            (in_RDI + 1)[(long)local_40] = (byte)(in_RDX->rdf_len >> 8);
            (in_RDI + 2)[(long)local_40] = (byte)in_RDX->rdf_len;
          }
          local_40 = in_stack_ffffffffffffffa8 + (long)local_40;
        }
        beltMACStart(in_RCX,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
        beltMACStepA(in_RCX,(size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        beltMACStepA(in_RCX,(size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        beltMACStepA(in_RCX,(size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        sVar3 = derTLEnc(poVar4,(u32)((ulong)in_RCX >> 0x20),(size_t)in_stack_ffffffffffffffa8);
        beltMACStepG(&in_stack_ffffffffffffffa0->cla,in_stack_ffffffffffffff98);
        memSet(in_stack_ffffffffffffffa0,(octet)((ulong)in_stack_ffffffffffffff98 >> 0x38),0x17388b)
        ;
        if (in_RSI != (size_t *)0x0) {
          *in_RSI = (size_t)(local_40 + sVar3 + 9);
        }
        local_4 = 0;
      }
      else {
        local_4 = 0x205;
      }
    }
  }
  return local_4;
}

Assistant:

err_t btokSMCmdWrap(octet apdu[], size_t* count, const apdu_cmd_t* cmd,
	void* state)
{
	size_t cdf_len;
	size_t cdf_len_len;
	size_t offset;
	size_t c;
	btok_sm_st* st;
	// pre
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(count, O_PER_S));
	// некорректная команда? команду нужно защитить, а она уже защищена?
	if (!apduCmdIsValid(cmd) || state && (cmd->cla & 0x04))
		return ERR_BAD_APDU;
	// кодировать без защиты
	offset = apduCmdEnc(apdu, cmd);
	if (offset == SIZE_MAX)
		return ERR_BAD_APDU;
	// состояние не задано, т.е. защита не нужна?
	if (!state)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), cmd, apduCmdSizeof(cmd)));
	// новая длина cdf
	cdf_len = cmd->cdf_len;
	if (cmd->cdf_len)
	{
		c = derTLEnc(0, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		cdf_len += c + 1;
	}
	if (cmd->rdf_len)
	{
		c = derEnc(0, 0x97, 0, apduCmdRDFLenLen(cmd));
		ASSERT(c != SIZE_MAX);
		cdf_len += c;
	}
	c = derEnc(0, 0x8E, 0, 8);
	ASSERT(c != SIZE_MAX);
	cdf_len += c;
	// новая длина длины cdf
	cdf_len_len = cdf_len < 256 ? 1 : 3;
	// общая длина
	offset = 4 + cdf_len_len + cdf_len + 1;
	// не задан выходной буфер, т.е. нужно определить только его длину?
	if (!apdu)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
			ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(apdu, offset, state, btokSM_keep()));
	ASSERT(memIsDisjoint2(apdu, offset, cmd, apduCmdSizeof(cmd)));
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 1)
		return ERR_BAD_LOGIC;
	// уточнить заголовок
	offset = 0;
	apdu[0] |= 0x04;
	offset += 4;
	// перейти к cdf
	offset += cdf_len_len;
	// обработать cdf
	if (cmd->cdf_len)
	{
		c = derTLEnc(0, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		// подготовить значение
		memMove(apdu + offset + c + 1,
			apdu + 4 + apduCmdCDFLenLen(cmd), cmd->cdf_len);
		apdu[offset + c] = 0x02;
		// кодировать TL
		c = derTLEnc(apdu + offset, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		offset += c + 1;
		// зашифровать
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepE(apdu + offset, cmd->cdf_len, st->stack);
		// дальше
		offset += cmd->cdf_len;
	}
	// теперь можно перекодировать Lc
	ASSERT(cdf_len_len == 1 || cdf_len_len == 3);
	if (cdf_len_len == 1)
		apdu[4] = (octet)cdf_len;
	else
	{
		apdu[4] = 0;
		apdu[5] = (octet)(cdf_len / 256);
		apdu[6] = (octet)cdf_len;
	}
	// обработать длину rdf
	if (cmd->rdf_len)
	{
		size_t l = apduCmdRDFLenLen(cmd);
		// кодировать TL
		c = derTLEnc(apdu + offset, 0x97, l);
		ASSERT(c != SIZE_MAX);
		offset += c;
		// кодировать значение
		ASSERT(1 <= l && l <= 3);
		if (l == 1)
			apdu[offset] = (octet)(cmd->rdf_len);
		else if (l == 2)
		{
			apdu[offset] = (octet)(cmd->rdf_len / 256);
			apdu[offset + 1] = (octet)cmd->rdf_len;
		}
		else
		{
			apdu[offset] = 0;
			apdu[offset + 1] = (octet)(cmd->rdf_len / 256);
			apdu[offset + 2] = (octet)cmd->rdf_len;
		}
		// дальше
		offset += l;
	}
	// вычислить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, 4, st->stack);
	ASSERT(offset >= 4 + cdf_len_len);
	beltMACStepA(apdu + 4 + cdf_len_len, offset - 4 - cdf_len_len, st->stack);
	c = derTLEnc(apdu + offset, 0x8E, 8);
	ASSERT(c != SIZE_MAX);
	offset += c;
	beltMACStepG(apdu + offset, st->stack);
	offset += 8;
	// кодировать новую длину rdf
	memSetZero(apdu + offset, 1);
	offset += 1;
	// возвратить длину
	if (count)
	{
		ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
		ASSERT(memIsDisjoint2(count, O_PER_S, apdu, offset));
		*count = offset;
	}
	// завершить
	return ERR_OK;
}